

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O2

ktx_error_code_e
ktxTexture_CreateFromStdioStream
          (FILE *stdioStream,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  
  if (newTex == (ktxTexture **)0x0 || stdioStream == (FILE *)0x0) {
    return KTX_INVALID_VALUE;
  }
  kVar1 = ktxFileStream_construct(&stream,stdioStream,false);
  if (kVar1 == KTX_SUCCESS) {
    kVar1 = ktxTexture_CreateFromStream(&stream,createFlags,newTex);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromStdioStream(FILE* stdioStream,
                                 ktxTextureCreateFlags createFlags,
                                 ktxTexture** newTex)
{
    ktxStream stream;
    KTX_error_code result;

    if (stdioStream == NULL || newTex == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;
}